

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O2

void __thiscall Matrix2f::setCol(Matrix2f *this,int j,Vector2f *v)

{
  float fVar1;
  
  fVar1 = Vector2f::x(v);
  this->m_elements[j * 2] = fVar1;
  fVar1 = Vector2f::y(v);
  this->m_elements[j * 2 + 1] = fVar1;
  return;
}

Assistant:

void Matrix2f::setCol( int j, const Vector2f& v )
{
	int colStart = 2 * j;

	m_elements[ colStart ] = v.x();
	m_elements[ colStart + 1 ] = v.y();
}